

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzpoint.cpp
# Opt level: O2

void pztopology::TPZPoint::ParametricDomainNodeCoord(int node,TPZVec<double> *nodeCoord)

{
  if (1 < node) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Topology/tpzpoint.cpp"
               ,0x3d);
  }
  (*nodeCoord->_vptr_TPZVec[2])(nodeCoord,0);
  if (node != 0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Topology/tpzpoint.cpp"
               ,0x48);
  }
  return;
}

Assistant:

void TPZPoint::ParametricDomainNodeCoord(int node, TPZVec<REAL> &nodeCoord)
    {

        if(node > NCornerNodes)
        {
            DebugStop();
        }
        nodeCoord.Resize(Dimension, 0.);
        switch (node) {
            case (0):
            {
                return;
                break;
            }
            default:
            {
                DebugStop();
                break;
            }
        }
    }